

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitStringLiteralExpression
          (SyntaxDumper *this,StringLiteralExpressionSyntax *node)

{
  StringLiteralExpressionSyntax *pSVar1;
  SyntaxToken local_50;
  StringLiteralExpressionSyntax *local_18;
  StringLiteralExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (StringLiteralExpressionSyntax *)this;
  traverseExpression(this,&node->super_ExpressionSyntax);
  StringLiteralExpressionSyntax::literalToken(&local_50,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pSVar1 = StringLiteralExpressionSyntax::adjacent(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pSVar1);
  return Skip;
}

Assistant:

virtual Action visitStringLiteralExpression(const StringLiteralExpressionSyntax* node) override
    {
        traverseExpression(node);
        terminal(node->literalToken(), node);
        nonterminal(node->adjacent());
        return Action::Skip;
    }